

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Stand(Map *this,Character *from)

{
  Character *other;
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  Character *character;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  undefined1 local_48 [8];
  PacketBuilder builder;
  Character *from_local;
  Map *this_local;
  
  from->sitting = SIT_STAND;
  builder.add_size = (size_t)from;
  Character::CancelSpell(from);
  PacketBuilder::PacketBuilder((PacketBuilder *)local_48,PACKET_SIT,PACKET_REMOVE,4);
  iVar2 = Character::PlayerID((Character *)builder.add_size);
  PacketBuilder::AddShort((PacketBuilder *)local_48,(unsigned_short)iVar2);
  PacketBuilder::AddChar((PacketBuilder *)local_48,*(uchar *)(builder.add_size + 0xc0));
  PacketBuilder::AddChar((PacketBuilder *)local_48,*(uchar *)(builder.add_size + 0xc1));
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  character = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&character), bVar1) {
    ppCVar3 = std::_List_iterator<Character_*>::operator*(&__end1);
    other = *ppCVar3;
    if ((other != (Character *)builder.add_size) &&
       (bVar1 = Character::InRange((Character *)builder.add_size,other), bVar1)) {
      Character::Send(other,(PacketBuilder *)local_48);
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_48);
  return;
}

Assistant:

void Map::Stand(Character *from)
{
	from->sitting = SIT_STAND;

	from->CancelSpell();

	PacketBuilder builder(PACKET_SIT, PACKET_REMOVE, 4);
	builder.AddShort(from->PlayerID());
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}